

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O3

void __thiscall aalcalc::outputrows(aalcalc *this,char *buffer,int strLen,FILE *fout)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  int extraout_EDX;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  aalcalc *this_00;
  ulong uVar11;
  uint *puVar12;
  double dVar13;
  char acStack_1070 [4104];
  char *pcStack_68;
  char *pcStack_60;
  char *pcStack_58;
  FILE *pFStack_50;
  ulong uStack_48;
  code *pcStack_40;
  
  uVar9 = (ulong)(uint)strLen;
  uVar11 = 1;
  pcVar7 = buffer;
  while( true ) {
    pcVar10 = "%s";
    pcStack_40 = (code *)0x104d1b;
    uVar2 = fprintf((FILE *)fout,"%s",pcVar7);
    if ((int)uVar2 < 0) {
      pcStack_40 = outputresultscsv_new<aal_rec>;
      this_00 = (aalcalc *)buffer;
      outputrows((aalcalc *)buffer);
      pcStack_60 = "%s";
      puVar12 = *(uint **)pcVar10;
      puVar5 = *(uint **)(pcVar10 + 8);
      if (puVar12 != puVar5) {
        iVar6 = extraout_EDX * this_00->no_of_periods_;
        pcStack_68 = pcVar7;
        pcStack_58 = buffer;
        pFStack_50 = fout;
        uStack_48 = uVar11;
        pcStack_40 = (code *)uVar9;
        do {
          if (0 < (int)*puVar12) {
            iVar3 = this_00->no_of_periods_;
            dVar1 = *(double *)(puVar12 + 2);
            dVar13 = (*(double *)(puVar12 + 4) - (dVar1 * dVar1) / (double)iVar6) /
                     (double)(iVar6 + -1);
            if (dVar13 < 0.0) {
              dVar13 = sqrt(dVar13);
            }
            else {
              dVar13 = SQRT(dVar13);
            }
            iVar3 = snprintf(acStack_1070,0x1000,"%d,%d,%f,%f",
                             (dVar1 / (double)extraout_EDX) / (double)iVar3,dVar13,(ulong)*puVar12,
                             (ulong)puVar12[1]);
            if ((this_00->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (this_00->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              iVar4 = snprintf(acStack_1070 + iVar3,(long)(0x1000 - iVar3),",0");
              iVar3 = iVar3 + iVar4;
            }
            iVar4 = snprintf(acStack_1070 + iVar3,(long)(0x1000 - iVar3),"\n");
            outputrows(this_00,acStack_1070,iVar3 + iVar4,_stdout);
            puVar5 = *(uint **)(pcVar10 + 8);
          }
          puVar12 = puVar12 + 6;
        } while (puVar12 != puVar5);
      }
      return;
    }
    iVar6 = (int)uVar9;
    uVar8 = iVar6 - uVar2;
    uVar9 = (ulong)uVar8;
    if (uVar8 == 0 || iVar6 < (int)uVar2) break;
    pcVar7 = pcVar7 + uVar2;
    pcStack_40 = (code *)0x104d46;
    fprintf(_stderr,"INFO: Attempt %d to write %s\n",uVar11,buffer);
    uVar2 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar2;
    if (uVar2 == 0xb) {
      pcStack_40 = (code *)0x104d57;
      outputrows((aalcalc *)buffer);
      return;
    }
  }
  return;
}

Assistant:

inline void aalcalc::outputrows(const char * buffer, int strLen, FILE * fout) {

	const char * bufPtr = buffer;
	int num;
	int counter = 0;
	do {

		num = fprintf(fout, "%s", bufPtr);
		if (num < 0) {   // Write error
			fprintf(stderr, "FATAL: Error writing %s: %s\n",
				buffer, strerror(errno));
			exit(EXIT_FAILURE);
		} else if (num < strLen) {   // Incomplete write
			bufPtr += num;
			strLen -= num;
		} else return;   // Success

		fprintf(stderr, "INFO: Attempt %d to write %s\n", ++counter,
			buffer);

	} while (counter < 10);

	fprintf(stderr, "FATAL: Maximum attempts to write %s exceeded\n",
		buffer);
	exit(EXIT_FAILURE);

}